

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addr.h
# Opt level: O0

void __thiscall
mocker::nasm::MemoryAddr::MemoryAddr(MemoryAddr *this,shared_ptr<mocker::nasm::Addr> *reg1)

{
  shared_ptr<mocker::nasm::Addr> *reg1_local;
  MemoryAddr *this_local;
  
  EffectiveAddr::EffectiveAddr(&this->super_EffectiveAddr);
  (this->super_EffectiveAddr).super_Addr._vptr_Addr = (_func_int **)&PTR__MemoryAddr_0039ab08;
  std::static_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
            ((shared_ptr<mocker::nasm::Addr> *)&this->reg1);
  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&this->reg2,(nullptr_t)0x0);
  this->scale = 0;
  this->number = 0;
  return;
}

Assistant:

explicit MemoryAddr(const std::shared_ptr<Addr> &reg1)
      : reg1(std::static_pointer_cast<Register>(reg1)) {}